

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_yoda_tests.cpp
# Opt level: O2

void __thiscall iu_NoYodaTest_x_iutest_x_Eq_Test::Body(iu_NoYodaTest_x_iutest_x_Eq_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  int *in_R9;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 1;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x12bfcb,"ga",(char *)&local_198,&ga,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
               ,0x2c,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Expected: 1",(allocator<char> *)&local_1c8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
               ,0x2c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_spi_ar);
    iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
    iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 1;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x12bfcb,"ga",(char *)&local_198,&ga,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
                 ,0x2d,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    pTVar2 = iutest::TestFlag::GetInstance();
    pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"Expected: 1",(allocator<char> *)&local_1c8);
    iutest::detail::SPIFailureChecker::GetResult
              (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    iutest::detail::NewTestPartResultCheckHelper::
    Collector<iutest::detail::NoTestPartResultReporter>::~Collector
              (&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
    if (iutest_spi_ar.m_result != false) goto LAB_00119dac;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
               ,0x2d,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_failure_checker);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_00119dac:
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(NoYodaTest, Eq)
{
    IUTEST_ASSERT_FATAL_FAILURE   ( IUTEST_ASSERT_EQ(ga, 1), "Expected: 1" );
    IUTEST_ASSERT_NONFATAL_FAILURE( IUTEST_EXPECT_EQ(ga, 1), "Expected: 1" );
}